

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O3

void __thiscall
wallet::COutput::COutput
          (COutput *this,COutPoint *outpoint,CTxOut *txout,int depth,int input_bytes,bool spendable,
          bool solvable,bool safe,int64_t time,bool from_me,optional<CFeeRate> feerate)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = false;
  uVar2 = *(undefined8 *)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar3 = *(undefined8 *)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar4 = *(undefined8 *)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)(this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)(outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  *(undefined8 *)((this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar2
  ;
  *(undefined8 *)((this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       uVar3;
  *(undefined8 *)((this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar4;
  (this->outpoint).n = outpoint->n;
  (this->txout).nValue = txout->nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&(this->txout).scriptPubKey.super_CScriptBase,&(txout->scriptPubKey).super_CScriptBase)
  ;
  this->depth = depth;
  this->input_bytes = input_bytes;
  this->spendable = spendable;
  this->solvable = solvable;
  this->safe = safe;
  this->time = time;
  this->from_me = from_me;
  this->long_term_fee = 0;
  this->ancestor_bump_fees = 0;
  if (feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged == true) {
    if (input_bytes < 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = CFeeRate::GetFee((CFeeRate *)&feerate,input_bytes);
    }
    (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_payload._M_value = lVar5;
    (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_engaged = true;
    (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = txout->nValue - lVar5;
    (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

COutput(const COutPoint& outpoint, const CTxOut& txout, int depth, int input_bytes, bool spendable, bool solvable, bool safe, int64_t time, bool from_me, const std::optional<CFeeRate> feerate = std::nullopt)
        : outpoint{outpoint},
          txout{txout},
          depth{depth},
          input_bytes{input_bytes},
          spendable{spendable},
          solvable{solvable},
          safe{safe},
          time{time},
          from_me{from_me}
    {
        if (feerate) {
            // base fee without considering potential unconfirmed ancestors
            fee = input_bytes < 0 ? 0 : feerate.value().GetFee(input_bytes);
            effective_value = txout.nValue - fee.value();
        }
    }